

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserSharedInputState.hpp
# Opt level: O0

void __thiscall antlr::ParserInputState::~ParserInputState(ParserInputState *this)

{
  ParserInputState *in_RDI;
  
  ~ParserInputState(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

virtual ~ParserInputState()
	{
		if (inputResponsible)
			delete input;
	}